

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.h
# Opt level: O0

void __thiscall uWS::HttpResponse<false>::writeUnsigned(HttpResponse<false> *this,uint value)

{
  uint uVar1;
  uint32_t in_ESI;
  AsyncSocket<false> *in_RDI;
  int length;
  char buf [10];
  char local_16 [22];
  
  uVar1 = utils::u32toa(in_ESI,local_16);
  AsyncSocket<false>::write(in_RDI,(int)local_16,(void *)(ulong)uVar1,0);
  return;
}

Assistant:

void writeUnsigned(unsigned int value) {
        char buf[10];
        int length = utils::u32toa(value, buf);

        /* For now we do this copy */
        Super::write(buf, length);
    }